

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parseurlandfillconn(Curl_easy *data,connectdata *conn)

{
  SASLproto *h;
  connectdata *pcVar1;
  uint uVar2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  stsentry *psVar8;
  uint uVar9;
  urlreject uVar10;
  char *local_b0;
  byte local_91;
  char *local_90;
  char *p;
  ulong uStack_80;
  _Bool valid;
  curl_off_t port;
  char *decoded_1;
  char *decoded;
  char *url_1;
  size_t hlen;
  char *newurl;
  char *url;
  char *pcStack_40;
  _Bool use_set_uh;
  char *hostname;
  CURLU *pCStack_30;
  CURLUcode uc;
  CURLU *uh;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_91 = 0;
  if ((data->set).uh != (CURLU *)0x0) {
    local_91 = (*(uint *)&(data->state).field_0x7be >> 3 & 1) != 0 ^ 0xff;
  }
  url._7_1_ = local_91 & 1;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  up_free(data);
  if ((url._7_1_ & 1) == 0) {
    pCStack_30 = curl_url();
    *(CURLU **)(conn_local[3].primary.local_ip + 0x22) = pCStack_30;
  }
  else {
    pCStack_30 = curl_url_dup((CURLU *)conn_local[1].proto.ftpc.pp.recvbuf.bufr);
    *(CURLU **)(conn_local[3].primary.local_ip + 0x22) = pCStack_30;
  }
  if (pCStack_30 == (CURLU *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((conn_local[1].recv[0] != (Curl_recv *)0x0) &&
     (sVar5 = Curl_is_absolute_url
                        (*(char **)(conn_local[3].secondary.local_ip + 6),(char *)0x0,0,true),
     sVar5 == 0)) {
    newurl = curl_maprintf("%s://%s",conn_local[1].recv[0],
                           *(undefined8 *)(conn_local[3].secondary.local_ip + 6));
    if (newurl == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) >> 0x10 & 1) != 0) {
      (*Curl_cfree)(*(void **)(conn_local[3].secondary.local_ip + 6));
    }
    *(char **)(conn_local[3].secondary.local_ip + 6) = newurl;
    *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) =
         *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 0xfffeffff | 0x10000;
  }
  if ((url._7_1_ & 1) == 0) {
    uVar9 = 0;
    if (((uint)((ulong)*(undefined8 *)((long)&conn_local[1].proto.ftpc.pp.statemachine + 4) >> 0x31)
        & 1) != 0) {
      uVar9 = 0x20;
    }
    uVar2 = 0;
    if (((uint)((ulong)*(undefined8 *)((long)&conn_local[1].proto.ftpc.pp.statemachine + 4) >> 0x2b)
        & 1) != 0) {
      uVar2 = 0x10;
    }
    hostname._4_4_ =
         curl_url_set(pCStack_30,CURLUPART_URL,*(char **)(conn_local[3].secondary.local_ip + 6),
                      uVar9 | 0x208 | uVar2);
    pcVar1 = conn_local;
    if (hostname._4_4_ != CURLUE_OK) {
      pcVar6 = curl_url_strerror(hostname._4_4_);
      Curl_failf((Curl_easy *)pcVar1,"URL rejected: %s",pcVar6);
      CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
      return CVar3;
    }
    hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_URL,(char **)&hlen,0);
    if (hostname._4_4_ != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
      return CVar3;
    }
    if ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) >> 0x10 & 1) != 0) {
      (*Curl_cfree)(*(void **)(conn_local[3].secondary.local_ip + 6));
    }
    *(size_t *)(conn_local[3].secondary.local_ip + 6) = hlen;
    *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) =
         *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 0xfffeffff | 0x10000;
  }
  hostname._4_4_ =
       curl_url_get(pCStack_30,CURLUPART_SCHEME,(char **)(conn_local[3].primary.local_ip + 0x2a),0);
  if (hostname._4_4_ == CURLUE_OK) {
    hostname._4_4_ =
         curl_url_get(pCStack_30,CURLUPART_HOST,(char **)&conn_local[3].primary.local_port,0);
    if (hostname._4_4_ == CURLUE_OK) {
      sVar7 = strlen(*(char **)&conn_local[3].primary.local_port);
      if (0xffff < sVar7) {
        Curl_failf((Curl_easy *)conn_local,"Too long hostname (maximum is %d)",0xffff);
        return CURLE_URL_MALFORMAT;
      }
    }
    else {
      iVar4 = curl_strequal("file",*(char **)(conn_local[3].primary.local_ip + 0x2a));
      if (iVar4 == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcStack_40 = *(char **)&conn_local[3].primary.local_port;
    if ((pcStack_40 != (char *)0x0) && (*pcStack_40 == '[')) {
      pcStack_20->bits = (ConnectBits)((ulong)pcStack_20->bits & 0xfffffffffffffbff | 0x400);
      pcStack_40 = pcStack_40 + 1;
      url_1 = (char *)strlen(pcStack_40);
      pcStack_40[(long)(url_1 + -1)] = '\0';
      zonefrom_url(pCStack_30,(Curl_easy *)conn_local,pcStack_20);
    }
    if (pcStack_40 == (char *)0x0) {
      local_b0 = "";
    }
    else {
      local_b0 = pcStack_40;
    }
    pcVar6 = (*Curl_cstrdup)(local_b0);
    (pcStack_20->host).rawalloc = pcVar6;
    if ((pcStack_20->host).rawalloc == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (pcStack_20->host).name = (pcStack_20->host).rawalloc;
      uh._4_4_ = Curl_idnconvert_hostname(&pcStack_20->host);
      data_local._4_4_ = uh._4_4_;
      if (uh._4_4_ == CURLE_OK) {
        if ((conn_local[1].proto.ftpc.account != (char *)0x0) &&
           (iVar4 = curl_strequal("http",*(char **)(conn_local[3].primary.local_ip + 0x2a)),
           iVar4 != 0)) {
          h = conn_local[1].proto.imapc.sasl.params;
          pcVar6 = (pcStack_20->host).name;
          sVar7 = strlen((pcStack_20->host).name);
          psVar8 = Curl_hsts((hsts *)h,pcVar6,sVar7,true);
          if (psVar8 != (stsentry *)0x0) {
            (*Curl_cfree)(*(void **)(conn_local[3].primary.local_ip + 0x2a));
            *(undefined8 *)(conn_local[3].primary.local_ip + 0x2a) = 0;
            hostname._4_4_ = curl_url_set(pCStack_30,CURLUPART_SCHEME,"https",0);
            if (hostname._4_4_ != CURLUE_OK) {
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
            if ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) >> 0x10 & 1) != 0) {
              (*Curl_cfree)(*(void **)(conn_local[3].secondary.local_ip + 6));
              pcVar1 = conn_local + 3;
              (pcVar1->secondary).local_ip[6] = '\0';
              (pcVar1->secondary).local_ip[7] = '\0';
              (pcVar1->secondary).local_ip[8] = '\0';
              (pcVar1->secondary).local_ip[9] = '\0';
              (pcVar1->secondary).local_ip[10] = '\0';
              (pcVar1->secondary).local_ip[0xb] = '\0';
              (pcVar1->secondary).local_ip[0xc] = '\0';
              (pcVar1->secondary).local_ip[0xd] = '\0';
            }
            hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_URL,&decoded,0);
            if (hostname._4_4_ != CURLUE_OK) {
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_SCHEME,
                              (char **)(conn_local[3].primary.local_ip + 0x2a),0);
            if (hostname._4_4_ != CURLUE_OK) {
              (*Curl_cfree)(decoded);
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
            *(char **)(conn_local[3].secondary.local_ip + 6) = decoded;
            *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) =
                 *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 0xfffeffff | 0x10000
            ;
            if (((conn_local != (connectdata *)0x0) &&
                ((*(ulong *)((long)&conn_local[1].proto.ftpc.pp.statemachine + 4) >> 0x1e & 1) != 0)
                ) && ((conn_local[3].ssl_config.issuercert == (char *)0x0 ||
                      (0 < *(int *)(conn_local[3].ssl_config.issuercert + 8))))) {
              Curl_infof((Curl_easy *)conn_local,"Switched from HTTP to HTTPS due to HSTS => %s",
                         *(undefined8 *)(conn_local[3].secondary.local_ip + 6));
            }
          }
        }
        uh._4_4_ = findprotocol((Curl_easy *)conn_local,pcStack_20,
                                *(char **)(conn_local[3].primary.local_ip + 0x2a));
        data_local._4_4_ = uh._4_4_;
        if (uh._4_4_ == CURLE_OK) {
          if ((conn_local[3].proxy_ssl_config.clientcert == (char *)0x0) ||
             ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 3) != 2)) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_PASSWORD,
                              (char **)(conn_local[3].secondary.remote_ip + 0x14),0);
            if (hostname._4_4_ == CURLUE_OK) {
              uVar10 = REJECT_CTRL;
              if ((pcStack_20->handler->flags & 0x2000) != 0) {
                uVar10 = REJECT_ZERO;
              }
              uh._4_4_ = Curl_urldecode(*(char **)(conn_local[3].secondary.remote_ip + 0x14),0,
                                        &decoded_1,(size_t *)0x0,uVar10);
              if (uh._4_4_ != CURLE_OK) {
                return uh._4_4_;
              }
              pcStack_20->passwd = decoded_1;
              CVar3 = Curl_setstropt(&conn_local[3].proxy_ssl_config.clientcert,decoded_1);
              if (CVar3 != CURLE_OK) {
                return CVar3;
              }
              *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) =
                   *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 0xfffffffc | 1;
              uh._4_4_ = CURLE_OK;
            }
            else if (hostname._4_4_ != CURLUE_NO_PASSWORD) {
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
          }
          if ((conn_local[3].proxy_ssl_config.issuercert == (char *)0x0) ||
             ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 3) != 2)) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_USER,
                              (char **)(conn_local[3].secondary.remote_ip + 0xc),0);
            if (hostname._4_4_ == CURLUE_OK) {
              uVar10 = REJECT_CTRL;
              if ((pcStack_20->handler->flags & 0x2000) != 0) {
                uVar10 = REJECT_ZERO;
              }
              uh._4_4_ = Curl_urldecode(*(char **)(conn_local[3].secondary.remote_ip + 0xc),0,
                                        (char **)&port,(size_t *)0x0,uVar10);
              if (uh._4_4_ != CURLE_OK) {
                return uh._4_4_;
              }
              pcStack_20->user = (char *)port;
              uh._4_4_ = Curl_setstropt(&conn_local[3].proxy_ssl_config.issuercert,(char *)port);
              *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) =
                   *(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) & 0xfffffffc | 1;
            }
            else if (hostname._4_4_ != CURLUE_NO_USER) {
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
            if (uh._4_4_ != CURLE_OK) {
              return uh._4_4_;
            }
          }
          hostname._4_4_ =
               curl_url_get(pCStack_30,CURLUPART_OPTIONS,
                            (char **)(conn_local[3].secondary.remote_ip + 0x1c),0x40);
          if (hostname._4_4_ == CURLUE_OK) {
            pcVar6 = (*Curl_cstrdup)(*(char **)(conn_local[3].secondary.remote_ip + 0x1c));
            pcStack_20->options = pcVar6;
            if (pcStack_20->options == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
          else if (hostname._4_4_ != CURLUE_NO_OPTIONS) {
            CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
            return CVar3;
          }
          hostname._4_4_ =
               curl_url_get(pCStack_30,CURLUPART_PATH,
                            (char **)(conn_local[3].secondary.remote_ip + 0x24),0x80);
          if (hostname._4_4_ == CURLUE_OK) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_PORT,
                              (char **)(conn_local[3].secondary.remote_ip + 4),1);
            if (hostname._4_4_ == CURLUE_OK) {
              p._7_1_ = 1;
              if ((*(short *)((long)&conn_local[1].proto + 0x84) == 0) ||
                 ((*(uint *)((long)&conn_local[3].proxy_ssl_config.CRLfile + 6) >> 6 & 1) == 0)) {
                local_90 = *(char **)(conn_local[3].secondary.remote_ip + 4);
                iVar4 = Curl_str_number(&local_90,(curl_off_t *)&stack0xffffffffffffff80,0xffff);
                if (iVar4 != 0) {
                  p._7_1_ = 0;
                }
              }
              else {
                uStack_80 = (ulong)*(ushort *)((long)&conn_local[1].proto + 0x84);
              }
              if ((p._7_1_ & 1) != 0) {
                uVar9 = (uint)uStack_80 & 0xffff;
                pcStack_20->remote_port = uVar9;
                (pcStack_20->primary).remote_port = uVar9;
              }
            }
            else {
              iVar4 = curl_strequal("file",*(char **)(conn_local[3].primary.local_ip + 0x2a));
              if (iVar4 == 0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            curl_url_get(pCStack_30,CURLUPART_QUERY,
                         (char **)(conn_local[3].secondary.remote_ip + 0x2c),0);
            if (conn_local[1].http_ntlm_state != NTLMSTATE_NONE) {
              pcStack_20->scope_id = conn_local[1].http_ntlm_state;
            }
            data_local._4_4_ = CURLE_OK;
          }
          else {
            data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
          }
        }
      }
    }
  }
  else {
    data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode parseurlandfillconn(struct Curl_easy *data,
                                    struct connectdata *conn)
{
  CURLcode result;
  CURLU *uh;
  CURLUcode uc;
  char *hostname;
  bool use_set_uh = (data->set.uh && !data->state.this_is_a_follow);

  up_free(data); /* cleanup previous leftovers first */

  /* parse the URL */
  if(use_set_uh) {
    uh = data->state.uh = curl_url_dup(data->set.uh);
  }
  else {
    uh = data->state.uh = curl_url();
  }

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  if(data->set.str[STRING_DEFAULT_PROTOCOL] &&
     !Curl_is_absolute_url(data->state.url, NULL, 0, TRUE)) {
    char *url = aprintf("%s://%s", data->set.str[STRING_DEFAULT_PROTOCOL],
                        data->state.url);
    if(!url)
      return CURLE_OUT_OF_MEMORY;
    if(data->state.url_alloc)
      free(data->state.url);
    data->state.url = url;
    data->state.url_alloc = TRUE;
  }

  if(!use_set_uh) {
    char *newurl;
    uc = curl_url_set(uh, CURLUPART_URL, data->state.url, (unsigned int)
                      (CURLU_GUESS_SCHEME |
                       CURLU_NON_SUPPORT_SCHEME |
                       (data->set.disallow_username_in_url ?
                        CURLU_DISALLOW_USER : 0) |
                       (data->set.path_as_is ? CURLU_PATH_AS_IS : 0)));
    if(uc) {
      failf(data, "URL rejected: %s", curl_url_strerror(uc));
      return Curl_uc_to_curlcode(uc);
    }

    /* after it was parsed, get the generated normalized version */
    uc = curl_url_get(uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(data->state.url_alloc)
      free(data->state.url);
    data->state.url = newurl;
    data->state.url_alloc = TRUE;
  }

  uc = curl_url_get(uh, CURLUPART_SCHEME, &data->state.up.scheme, 0);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_HOST, &data->state.up.hostname, 0);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }
  else if(strlen(data->state.up.hostname) > MAX_URL_LEN) {
    failf(data, "Too long hostname (maximum is %d)", MAX_URL_LEN);
    return CURLE_URL_MALFORMAT;
  }
  hostname = data->state.up.hostname;

  if(hostname && hostname[0] == '[') {
    /* This looks like an IPv6 address literal. See if there is an address
       scope. */
    size_t hlen;
    conn->bits.ipv6_ip = TRUE;
    /* cut off the brackets! */
    hostname++;
    hlen = strlen(hostname);
    hostname[hlen - 1] = 0;

    zonefrom_url(uh, data, conn);
  }

  /* make sure the connect struct gets its own copy of the hostname */
  conn->host.rawalloc = strdup(hostname ? hostname : "");
  if(!conn->host.rawalloc)
    return CURLE_OUT_OF_MEMORY;
  conn->host.name = conn->host.rawalloc;

  /*************************************************************
   * IDN-convert the hostnames
   *************************************************************/
  result = Curl_idnconvert_hostname(&conn->host);
  if(result)
    return result;

#ifndef CURL_DISABLE_HSTS
  /* HSTS upgrade */
  if(data->hsts && strcasecompare("http", data->state.up.scheme)) {
    /* This MUST use the IDN decoded name */
    if(Curl_hsts(data->hsts, conn->host.name, strlen(conn->host.name), TRUE)) {
      char *url;
      Curl_safefree(data->state.up.scheme);
      uc = curl_url_set(uh, CURLUPART_SCHEME, "https", 0);
      if(uc)
        return Curl_uc_to_curlcode(uc);
      if(data->state.url_alloc)
        Curl_safefree(data->state.url);
      /* after update, get the updated version */
      uc = curl_url_get(uh, CURLUPART_URL, &url, 0);
      if(uc)
        return Curl_uc_to_curlcode(uc);
      uc = curl_url_get(uh, CURLUPART_SCHEME, &data->state.up.scheme, 0);
      if(uc) {
        free(url);
        return Curl_uc_to_curlcode(uc);
      }
      data->state.url = url;
      data->state.url_alloc = TRUE;
      infof(data, "Switched from HTTP to HTTPS due to HSTS => %s",
            data->state.url);
    }
  }
#endif

  result = findprotocol(data, conn, data->state.up.scheme);
  if(result)
    return result;

  /*
   * username and password set with their own options override the credentials
   * possibly set in the URL, but netrc does not.
   */
  if(!data->state.aptr.passwd || (data->state.creds_from != CREDS_OPTION)) {
    uc = curl_url_get(uh, CURLUPART_PASSWORD, &data->state.up.password, 0);
    if(!uc) {
      char *decoded;
      result = Curl_urldecode(data->state.up.password, 0, &decoded, NULL,
                              conn->handler->flags&PROTOPT_USERPWDCTRL ?
                              REJECT_ZERO : REJECT_CTRL);
      if(result)
        return result;
      conn->passwd = decoded;
      result = Curl_setstropt(&data->state.aptr.passwd, decoded);
      if(result)
        return result;
      data->state.creds_from = CREDS_URL;
    }
    else if(uc != CURLUE_NO_PASSWORD)
      return Curl_uc_to_curlcode(uc);
  }

  if(!data->state.aptr.user || (data->state.creds_from != CREDS_OPTION)) {
    /* we do not use the URL API's URL decoder option here since it rejects
       control codes and we want to allow them for some schemes in the user
       and password fields */
    uc = curl_url_get(uh, CURLUPART_USER, &data->state.up.user, 0);
    if(!uc) {
      char *decoded;
      result = Curl_urldecode(data->state.up.user, 0, &decoded, NULL,
                              conn->handler->flags&PROTOPT_USERPWDCTRL ?
                              REJECT_ZERO : REJECT_CTRL);
      if(result)
        return result;
      conn->user = decoded;
      result = Curl_setstropt(&data->state.aptr.user, decoded);
      data->state.creds_from = CREDS_URL;
    }
    else if(uc != CURLUE_NO_USER)
      return Curl_uc_to_curlcode(uc);
    if(result)
      return result;
  }

  uc = curl_url_get(uh, CURLUPART_OPTIONS, &data->state.up.options,
                    CURLU_URLDECODE);
  if(!uc) {
    conn->options = strdup(data->state.up.options);
    if(!conn->options)
      return CURLE_OUT_OF_MEMORY;
  }
  else if(uc != CURLUE_NO_OPTIONS)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PATH, &data->state.up.path,
                    CURLU_URLENCODE);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PORT, &data->state.up.port,
                    CURLU_DEFAULT_PORT);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    curl_off_t port;
    bool valid = TRUE;
    if(data->set.use_port && data->state.allow_port)
      port = data->set.use_port;
    else {
      const char *p = data->state.up.port;
      if(Curl_str_number(&p, &port, 0xffff))
        valid = FALSE;
    }
    if(valid)
      conn->primary.remote_port = conn->remote_port = (unsigned short)port;
  }

  (void)curl_url_get(uh, CURLUPART_QUERY, &data->state.up.query, 0);

#ifdef USE_IPV6
  if(data->set.scope_id)
    /* Override any scope that was set above.  */
    conn->scope_id = data->set.scope_id;
#endif

  return CURLE_OK;
}